

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

size_t google::protobuf::internal::VarintSize<true,false,int>(int *data,int n)

{
  ulong uVar1;
  size_t sVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  
  uVar1 = 0;
  uVar5 = n & 0xffffffe0;
  uVar6 = 0;
  if (0 < (int)uVar5) {
    uVar6 = (ulong)uVar5;
  }
  for (; uVar6 != uVar1; uVar1 = uVar1 + 1) {
    uVar3 = data[uVar1] >> 0x1f ^ data[uVar1] * 2;
    auVar7._0_4_ = -(uint)(-0x7fffff81 < (int)(uVar3 ^ 0x80000000));
    auVar7._4_4_ = -(uint)(-0x7fffc001 < (int)(uVar3 ^ 0x80000000));
    auVar7._8_4_ = -(uint)(-0x7fe00001 < (int)(uVar3 ^ 0x80000000));
    auVar7._12_4_ = -(uint)(-0x70000001 < (int)(uVar3 ^ 0x80000000));
    iVar4 = movmskps(uVar3,auVar7);
    uVar5 = uVar5 + ((uint)(0x4332322132212110 >> ((byte)(iVar4 << 2) & 0x3f)) & 7);
  }
  for (; (long)uVar6 < (long)n; uVar6 = uVar6 + 1) {
    sVar2 = WireFormatLite::SInt32Size(data[uVar6]);
    uVar5 = uVar5 + (int)sVar2;
  }
  return (ulong)uVar5;
}

Assistant:

static size_t VarintSize(const T* data, const int n) {
  static_assert(sizeof(T) == 4, "This routine only works for 32 bit integers");
  // is_unsigned<T> => !ZigZag
  static_assert(
      (std::is_unsigned<T>::value ^ ZigZag) || std::is_signed<T>::value,
      "Cannot ZigZag encode unsigned types");
  // is_unsigned<T> => !SignExtended
  static_assert(
      (std::is_unsigned<T>::value ^ SignExtended) || std::is_signed<T>::value,
      "Cannot SignExtended unsigned types");
  static_assert(!(SignExtended && ZigZag),
                "Cannot SignExtended and ZigZag on the same type");
  // This approach is only faster when vectorized, and the vectorized
  // implementation only works in units of the platform's vector width, and is
  // only faster once a certain number of iterations are used. Normally the
  // compiler generates two loops - one partially unrolled vectorized loop that
  // processes big chunks, and a second "epilogue" scalar loop to finish up the
  // remainder. This is done manually here so that the faster scalar
  // implementation is used for small inputs and for the epilogue.
  int vectorN = n & -32;
  uint32_t sum = vectorN;
  uint32_t msb_sum = 0;
  int i = 0;
  for (; i < vectorN; i++) {
    uint32_t x = data[i];
    if (ZigZag) {
      x = WireFormatLite::ZigZagEncode32(x);
    } else if (SignExtended) {
      msb_sum += x >> 31;
    }
    // clang is so smart that it produces optimal SIMD sequence unrolling
    // the loop 8 ints at a time. With a sequence of 4
    // cmpres = cmpgt x, sizeclass  ( -1 or 0)
    // sum = sum - cmpres
    if (x > 0x7F) sum++;
    if (x > 0x3FFF) sum++;
    if (x > 0x1FFFFF) sum++;
    if (x > 0xFFFFFFF) sum++;
  }
#ifdef __clang__
// Clang is not smart enough to see that this loop doesn't run many times
// NOLINTNEXTLINE(google3-runtime-pragma-loop-hint): b/315043579
#pragma clang loop vectorize(disable) unroll(disable) interleave(disable)
#endif
  for (; i < n; i++) {
    uint32_t x = data[i];
    if (ZigZag) {
      sum += WireFormatLite::SInt32Size(x);
    } else if (SignExtended) {
      sum += WireFormatLite::Int32Size(x);
    } else {
      sum += WireFormatLite::UInt32Size(x);
    }
  }
  if (SignExtended) sum += msb_sum * 5;
  return sum;
}